

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  ImGuiContextHook *pIVar4;
  ImGuiWindow *window;
  ImDrawList *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  ImDrawList **ppIVar9;
  ImGuiContext *g;
  ulong uVar10;
  int iVar11;
  int n;
  long lVar12;
  ImGuiWindow *pIVar13;
  long lVar14;
  ImGuiWindow *pIVar15;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiWindow *local_48 [3];
  
  pIVar6 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar6->FrameCountRendered = pIVar6->FrameCount;
  (pIVar6->IO).MetricsRenderWindows = 0;
  out_list = &pIVar6->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  if (0 < (pIVar6->Hooks).Size) {
    lVar12 = 0;
    lVar14 = 0;
    do {
      pIVar4 = (pIVar6->Hooks).Data;
      if (*(int *)(pIVar4 + lVar12) == 4) {
        (**(code **)(pIVar4 + lVar12 + 8))(pIVar6,pIVar4 + lVar12);
      }
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 0x18;
    } while (lVar14 < (pIVar6->Hooks).Size);
  }
  if ((pIVar6->BackgroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar6->BackgroundDrawList);
  }
  pIVar15 = pIVar6->NavWindowingTarget;
  if ((pIVar15 == (ImGuiWindow *)0x0) || ((pIVar15->Flags & 0x2000) != 0)) {
    pIVar13 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar13 = pIVar15->RootWindow;
  }
  local_48[0] = pIVar13;
  if (pIVar15 == (ImGuiWindow *)0x0) {
    pIVar15 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar15 = pIVar6->NavWindowingListWindow;
  }
  local_48[1] = pIVar15;
  if ((pIVar6->Windows).Size != 0) {
    uVar10 = 0;
    do {
      window = (pIVar6->Windows).Data[uVar10];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar15 && window != pIVar13) && (window->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawData((ImVector<ImDrawList_*> *)
                            ((long)&(GImGui->DrawDataBuilder).Layers[0].Size +
                            (ulong)((uint)window->Flags >> 0x15 & 0x10)),window);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)(pIVar6->Windows).Size);
  }
  lVar12 = 0;
  do {
    pIVar15 = local_48[lVar12];
    if (((pIVar15 != (ImGuiWindow *)0x0) && (pIVar15->Active == true)) && (pIVar15->Hidden == false)
       ) {
      AddWindowToDrawData((ImVector<ImDrawList_*> *)
                          ((long)&(GImGui->DrawDataBuilder).Layers[0].Size +
                          (ulong)((uint)pIVar15->Flags >> 0x15 & 0x10)),pIVar15);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  if ((pIVar6->IO).MouseDrawCursor != false) {
    RenderMouseCursor(&pIVar6->ForegroundDrawList,(pIVar6->IO).MousePos,
                      (pIVar6->Style).MouseCursorScale,pIVar6->MouseCursor,0xffffffff,0xff000000,
                      0x30000000);
  }
  if ((pIVar6->ForegroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar6->ForegroundDrawList);
  }
  pIVar7 = GImGui;
  (pIVar6->DrawData).Valid = true;
  iVar3 = (pIVar6->DrawDataBuilder).Layers[0].Size;
  if ((long)iVar3 < 1) {
    ppIVar9 = (ImDrawList **)0x0;
  }
  else {
    ppIVar9 = (pIVar6->DrawDataBuilder).Layers[0].Data;
  }
  (pIVar6->DrawData).CmdLists = ppIVar9;
  (pIVar6->DrawData).CmdListsCount = iVar3;
  (pIVar6->DrawData).TotalIdxCount = 0;
  (pIVar6->DrawData).TotalVtxCount = 0;
  (pIVar6->DrawData).DisplayPos.x = 0.0;
  (pIVar6->DrawData).DisplayPos.y = 0.0;
  (pIVar6->DrawData).DisplaySize = (pIVar7->IO).DisplaySize;
  (pIVar6->DrawData).FramebufferScale = (pIVar7->IO).DisplayFramebufferScale;
  if (0 < iVar3) {
    iVar8 = (pIVar6->DrawData).TotalIdxCount;
    iVar11 = (pIVar6->DrawData).TotalVtxCount;
    lVar12 = 0;
    do {
      pIVar5 = (pIVar6->DrawDataBuilder).Layers[0].Data[lVar12];
      iVar11 = iVar11 + (pIVar5->VtxBuffer).Size;
      iVar8 = iVar8 + (pIVar5->IdxBuffer).Size;
      lVar12 = lVar12 + 1;
    } while (iVar3 != lVar12);
    (pIVar6->DrawData).TotalVtxCount = iVar11;
    (pIVar6->DrawData).TotalIdxCount = iVar8;
  }
  uVar1 = (pIVar6->DrawData).TotalIdxCount;
  uVar2 = (pIVar6->DrawData).TotalVtxCount;
  (pIVar6->IO).MetricsRenderVertices = uVar2;
  (pIVar6->IO).MetricsRenderIndices = uVar1;
  if (0 < (pIVar6->Hooks).Size) {
    lVar12 = 0;
    lVar14 = 0;
    do {
      pIVar4 = (pIVar6->Hooks).Data;
      if (*(int *)(pIVar4 + lVar12) == 5) {
        (**(code **)(pIVar4 + lVar12 + 8))(pIVar6,pIVar4 + lVar12);
      }
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 0x18;
    } while (lVar14 < (pIVar6->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Add foreground ImDrawList
    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}